

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O1

APInt * __thiscall llvm::APInt::operator+=(APInt *this,uint64_t RHS)

{
  uint uVar1;
  uint64_t *puVar2;
  APInt *pAVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar1 = this->BitWidth;
  if ((ulong)uVar1 < 0x41) {
    (this->U).pVal = (uint64_t *)((long)(this->U).pVal + RHS);
    pAVar3 = clearUnusedBits(this);
    return pAVar3;
  }
  puVar2 = (this->U).pVal;
  lVar4 = 0;
  do {
    uVar5 = puVar2[lVar4] + RHS;
    puVar2[lVar4] = uVar5;
    if (RHS <= uVar5) break;
    RHS = 1;
    bVar6 = ((ulong)uVar1 + 0x3f >> 6) - 1 != lVar4;
    lVar4 = lVar4 + 1;
  } while (bVar6);
  pAVar3 = this;
  uVar1 = this->BitWidth;
  if (0x40 < (ulong)uVar1) {
    this = (APInt *)((this->U).pVal + ((int)((ulong)uVar1 + 0x3f >> 6) - 1));
  }
  (this->U).VAL = ((this->U).VAL << (-(char)uVar1 & 0x3fU)) >> (-(char)uVar1 & 0x3fU);
  return pAVar3;
}

Assistant:

bool isSingleWord() const { return BitWidth <= APINT_BITS_PER_WORD; }